

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension.h
# Opt level: O0

void __thiscall
absl::lts_20250127::str_format_internal::FormatSinkImpl::Append
          (FormatSinkImpl *this,size_t n,char c)

{
  size_t sVar1;
  undefined1 local_30 [8];
  anon_class_16_2_fd512dd0 raw_append;
  size_t sStack_18;
  char c_local;
  size_t n_local;
  FormatSinkImpl *this_local;
  
  if (n != 0) {
    this->size_ = n + this->size_;
    raw_append.this = (FormatSinkImpl *)((long)&raw_append.c + 7);
    local_30 = (undefined1  [8])this;
    raw_append.c._7_1_ = c;
    sStack_18 = n;
    while (sVar1 = Avail(this), sVar1 < sStack_18) {
      sVar1 = Avail(this);
      sStack_18 = sStack_18 - sVar1;
      sVar1 = Avail(this);
      if (sVar1 != 0) {
        sVar1 = Avail(this);
        Append::anon_class_16_2_fd512dd0::operator()((anon_class_16_2_fd512dd0 *)local_30,sVar1);
      }
      Flush(this);
    }
    Append::anon_class_16_2_fd512dd0::operator()((anon_class_16_2_fd512dd0 *)local_30,sStack_18);
  }
  return;
}

Assistant:

void Append(size_t n, char c) {
    if (n == 0) return;
    size_ += n;
    auto raw_append = [&](size_t count) {
      memset(pos_, c, count);
      pos_ += count;
    };
    while (n > Avail()) {
      n -= Avail();
      if (Avail() > 0) {
        raw_append(Avail());
      }
      Flush();
    }
    raw_append(n);
  }